

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

int __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::selectLeave(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *val,
             number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *param_2,bool polish)

{
  double dVar1;
  char cVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined8 uVar5;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  SPxId *pSVar7;
  int iVar8;
  uint leave;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar11;
  bool bVar12;
  ulong uVar13;
  Real a;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_4d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxabs;
  cpp_dec_float<50U,_int,_void> vv;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  bestDelta;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  delta_shift;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sel;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_268;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_228;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  lowstab;
  
  maxabs.m_backend.fpclass = cpp_dec_float_finite;
  maxabs.m_backend.prec_elem = 10;
  maxabs.m_backend.data._M_elems[0] = 0;
  maxabs.m_backend.data._M_elems[1] = 0;
  maxabs.m_backend.data._M_elems[2] = 0;
  maxabs.m_backend.data._M_elems[3] = 0;
  maxabs.m_backend.data._M_elems[4] = 0;
  maxabs.m_backend.data._M_elems[5] = 0;
  maxabs.m_backend.data._M_elems._24_5_ = 0;
  maxabs.m_backend.data._M_elems[7]._1_3_ = 0;
  maxabs.m_backend.data._M_elems._32_5_ = 0;
  maxabs.m_backend.data._M_elems[9]._1_3_ = 0;
  maxabs.m_backend.exp = 0;
  maxabs.m_backend.neg = false;
  local_4d8.fpclass = cpp_dec_float_finite;
  local_4d8.prec_elem = 10;
  local_4d8.data._M_elems[0] = 0;
  local_4d8.data._M_elems[1] = 0;
  local_4d8.data._M_elems[2] = 0;
  local_4d8.data._M_elems[3] = 0;
  local_4d8.data._M_elems[4] = 0;
  local_4d8.data._M_elems[5] = 0;
  local_4d8.data._M_elems._24_5_ = 0;
  local_4d8.data._M_elems[7]._1_3_ = 0;
  local_4d8.data._M_elems._32_5_ = 0;
  local_4d8.data._M_elems[9]._1_3_ = 0;
  local_4d8.exp = 0;
  local_4d8.neg = false;
  sel.m_backend.fpclass = cpp_dec_float_finite;
  sel.m_backend.prec_elem = 10;
  sel.m_backend.data._M_elems[0] = 0;
  sel.m_backend.data._M_elems[1] = 0;
  sel.m_backend.data._M_elems[2] = 0;
  sel.m_backend.data._M_elems[3] = 0;
  sel.m_backend.data._M_elems[4] = 0;
  sel.m_backend.data._M_elems[5] = 0;
  sel.m_backend.data._M_elems._24_5_ = 0;
  sel.m_backend.data._M_elems[7]._1_3_ = 0;
  sel.m_backend.data._M_elems._32_5_ = 0;
  sel.m_backend.data._M_elems[9]._1_3_ = 0;
  sel.m_backend.exp = 0;
  sel.m_backend.neg = false;
  peVar3 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  dVar1 = peVar3->s_epsilon_multiplier;
  uVar13 = -(ulong)(dVar1 == 1.0);
  delta_shift.m_backend.fpclass = cpp_dec_float_finite;
  delta_shift.m_backend.prec_elem = 10;
  delta_shift.m_backend.data._M_elems[0] = 0;
  delta_shift.m_backend.data._M_elems[1] = 0;
  delta_shift.m_backend.data._M_elems[2] = 0;
  delta_shift.m_backend.data._M_elems[3] = 0;
  delta_shift.m_backend.data._M_elems[4] = 0;
  delta_shift.m_backend.data._M_elems[5] = 0;
  delta_shift.m_backend.data._M_elems._24_5_ = 0;
  delta_shift.m_backend.data._M_elems[7]._1_3_ = 0;
  delta_shift.m_backend.data._M_elems._32_5_ = 0;
  delta_shift.m_backend.data._M_elems[9]._1_3_ = 0;
  delta_shift.m_backend.exp = 0;
  delta_shift.m_backend.neg = false;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&delta_shift,
             (double)(~uVar13 & (ulong)(dVar1 * 1e-05) | uVar13 & 0x3ee4f8b588e368f1));
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  iVar8 = (*(this->
            super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SPxRatioTester[3])(this);
  cVar2 = *(char *)(CONCAT44(extraout_var,iVar8) + 0x6b4);
  peVar3 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var4 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  dVar1 = peVar3->s_epsilon_multiplier;
  uVar13 = -(ulong)(dVar1 == 1.0);
  lowstab.m_backend.fpclass = cpp_dec_float_finite;
  lowstab.m_backend.prec_elem = 10;
  lowstab.m_backend.data._M_elems[0] = 0;
  lowstab.m_backend.data._M_elems[1] = 0;
  lowstab.m_backend.data._M_elems[2] = 0;
  lowstab.m_backend.data._M_elems[3] = 0;
  lowstab.m_backend.data._M_elems[4] = 0;
  lowstab.m_backend.data._M_elems[5] = 0;
  lowstab.m_backend.data._M_elems._24_5_ = 0;
  lowstab.m_backend.data._M_elems[7]._1_3_ = 0;
  lowstab.m_backend.data._M_elems._32_5_ = 0;
  lowstab.m_backend._37_8_ = 0;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)&lowstab,
             (double)(~uVar13 & (ulong)(dVar1 * 1e-10) | uVar13 & 0x3ddb7cdfd9d7bdbb));
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  resetTols(this);
  uVar5 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
  vv.data._M_elems._32_5_ = SUB85(uVar5,0);
  vv.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
  vv.data._M_elems._0_8_ = *(undefined8 *)(this->epsilon).m_backend.data._M_elems;
  vv.data._M_elems._8_8_ = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
  vv.data._M_elems._16_8_ = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
  uVar5 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
  vv.data._M_elems._24_5_ = SUB85(uVar5,0);
  vv.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
  vv.exp = (this->epsilon).m_backend.exp;
  vv.neg = (this->epsilon).m_backend.neg;
  vv.fpclass = (this->epsilon).m_backend.fpclass;
  vv.prec_elem = (this->epsilon).m_backend.prec_elem;
  if ((vv.fpclass == cpp_dec_float_NaN || (val->m_backend).fpclass == cpp_dec_float_NaN) ||
     (iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                        (&val->m_backend,&vv), iVar8 < 1)) {
    uVar5 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 8);
    vv.data._M_elems._32_5_ = SUB85(uVar5,0);
    vv.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    vv.data._M_elems._0_8_ = *(undefined8 *)(this->epsilon).m_backend.data._M_elems;
    vv.data._M_elems._8_8_ = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 2);
    vv.data._M_elems._16_8_ = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 4);
    uVar5 = *(undefined8 *)((this->epsilon).m_backend.data._M_elems + 6);
    vv.data._M_elems._24_5_ = SUB85(uVar5,0);
    vv.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
    vv.exp = (this->epsilon).m_backend.exp;
    vv.neg = (this->epsilon).m_backend.neg;
    vv.fpclass = (this->epsilon).m_backend.fpclass;
    vv.prec_elem = (this->epsilon).m_backend.prec_elem;
    if (vv.data._M_elems[0] != 0 || vv.fpclass != cpp_dec_float_finite) {
      vv.neg = (bool)(vv.neg ^ 1);
    }
    if (vv.fpclass == cpp_dec_float_NaN) {
      return -1;
    }
    if ((val->m_backend).fpclass == cpp_dec_float_NaN) {
      return -1;
    }
    iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&val->m_backend,&vv);
    if (-1 < iVar8) {
      return -1;
    }
    iVar8 = 0;
    do {
      uVar5 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
      local_4d8.data._M_elems._32_5_ = SUB85(uVar5,0);
      local_4d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_4d8.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
      local_4d8.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
      local_4d8.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
      uVar5 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
      local_4d8.data._M_elems._24_5_ = SUB85(uVar5,0);
      local_4d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_4d8.exp = (val->m_backend).exp;
      local_4d8.neg = (val->m_backend).neg;
      local_4d8.fpclass = (val->m_backend).fpclass;
      local_4d8.prec_elem = (val->m_backend).prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=(&maxabs.m_backend,0)
      ;
      pSVar6 = (this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      leave = minDelta(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_4d8,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&maxabs.m_backend,pSVar6->theFvec,&pSVar6->theLBbound,&pSVar6->theUBbound,
                       0,1);
      bVar12 = false;
      if ((local_4d8.fpclass != cpp_dec_float_NaN) &&
         (bVar12 = false, (val->m_backend).fpclass != cpp_dec_float_NaN)) {
        iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_4d8,&val->m_backend);
        bVar12 = iVar9 == 0;
      }
      if (leave == 0xffffffff) {
        return -1;
      }
      if (bVar12) {
        return -1;
      }
      local_1e8.m_backend.data._M_elems[9]._1_3_ = maxabs.m_backend.data._M_elems[9]._1_3_;
      local_1e8.m_backend.data._M_elems._32_5_ = maxabs.m_backend.data._M_elems._32_5_;
      local_1e8.m_backend.data._M_elems[7]._1_3_ = maxabs.m_backend.data._M_elems[7]._1_3_;
      local_1e8.m_backend.data._M_elems._24_5_ = maxabs.m_backend.data._M_elems._24_5_;
      local_1e8.m_backend.data._M_elems[4] = maxabs.m_backend.data._M_elems[4];
      local_1e8.m_backend.data._M_elems[5] = maxabs.m_backend.data._M_elems[5];
      local_1e8.m_backend.data._M_elems[0] = maxabs.m_backend.data._M_elems[0];
      local_1e8.m_backend.data._M_elems[1] = maxabs.m_backend.data._M_elems[1];
      local_1e8.m_backend.data._M_elems[2] = maxabs.m_backend.data._M_elems[2];
      local_1e8.m_backend.data._M_elems[3] = maxabs.m_backend.data._M_elems[3];
      local_1e8.m_backend.exp = maxabs.m_backend.exp;
      local_1e8.m_backend.neg = maxabs.m_backend.neg;
      local_1e8.m_backend.fpclass = maxabs.m_backend.fpclass;
      local_1e8.m_backend.prec_elem = maxabs.m_backend.prec_elem;
      bVar12 = minShortLeave(this,&sel,leave,&local_1e8);
      if (!bVar12) {
        result_5.m_backend.fpclass = cpp_dec_float_finite;
        result_5.m_backend.prec_elem = 10;
        result_5.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result_5.m_backend.data._M_elems[4] = 0;
        result_5.m_backend.data._M_elems[5] = 0;
        result_5.m_backend.data._M_elems._24_5_ = 0;
        result_5.m_backend.data._M_elems[7]._1_3_ = 0;
        result_5.m_backend.data._M_elems._32_5_ = 0;
        result_5.m_backend.data._M_elems[9]._1_3_ = 0;
        result_5.m_backend.exp = 0;
        result_5.m_backend.neg = false;
        bestDelta.m_backend.fpclass = cpp_dec_float_finite;
        bestDelta.m_backend.prec_elem = 10;
        bestDelta.m_backend.data._M_elems[0] = 0;
        bestDelta.m_backend.data._M_elems[1] = 0;
        bestDelta.m_backend.data._M_elems[2] = 0;
        bestDelta.m_backend.data._M_elems[3] = 0;
        bestDelta.m_backend.data._M_elems[4] = 0;
        bestDelta.m_backend.data._M_elems[5] = 0;
        bestDelta.m_backend.data._M_elems._24_5_ = 0;
        bestDelta.m_backend.data._M_elems[7]._1_3_ = 0;
        bestDelta.m_backend.data._M_elems._32_5_ = 0;
        bestDelta.m_backend.data._M_elems[9]._1_3_ = 0;
        bestDelta.m_backend.exp = 0;
        bestDelta.m_backend.neg = false;
        local_228.m_backend.data._M_elems[7]._1_3_ = maxabs.m_backend.data._M_elems[7]._1_3_;
        local_228.m_backend.data._M_elems._24_5_ = maxabs.m_backend.data._M_elems._24_5_;
        local_228.m_backend.data._M_elems[0] = maxabs.m_backend.data._M_elems[0];
        local_228.m_backend.data._M_elems[1] = maxabs.m_backend.data._M_elems[1];
        local_228.m_backend.data._M_elems[2] = maxabs.m_backend.data._M_elems[2];
        local_228.m_backend.data._M_elems[3] = maxabs.m_backend.data._M_elems[3];
        local_228.m_backend.data._M_elems[4] = maxabs.m_backend.data._M_elems[4];
        local_228.m_backend.data._M_elems[5] = maxabs.m_backend.data._M_elems[5];
        local_228.m_backend.data._M_elems[9]._1_3_ = maxabs.m_backend.data._M_elems[9]._1_3_;
        local_228.m_backend.data._M_elems._32_5_ = maxabs.m_backend.data._M_elems._32_5_;
        local_228.m_backend.exp = maxabs.m_backend.exp;
        local_228.m_backend.neg = maxabs.m_backend.neg;
        local_228.m_backend.fpclass = maxabs.m_backend.fpclass;
        local_228.m_backend.prec_elem = maxabs.m_backend.prec_elem;
        minStability(&local_3a0,this,&local_228);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        vv.fpclass = cpp_dec_float_finite;
        vv.prec_elem = 10;
        vv.data._M_elems[0] = 0;
        vv.data._M_elems[1] = 0;
        vv.data._M_elems[2] = 0;
        vv.data._M_elems[3] = 0;
        vv.data._M_elems[4] = 0;
        vv.data._M_elems[5] = 0;
        vv.data._M_elems._24_5_ = 0;
        vv.data._M_elems[7]._1_3_ = 0;
        vv.data._M_elems._32_5_ = 0;
        vv.data._M_elems[9]._1_3_ = 0;
        vv.exp = 0;
        vv.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&vv,100.0);
        result.m_backend.data._M_elems[0] = local_3a0.m_backend.data._M_elems[0];
        result.m_backend.data._M_elems[1] = local_3a0.m_backend.data._M_elems[1];
        result.m_backend.data._M_elems[2] = local_3a0.m_backend.data._M_elems[2];
        result.m_backend.data._M_elems[3] = local_3a0.m_backend.data._M_elems[3];
        result.m_backend.data._M_elems[4] = local_3a0.m_backend.data._M_elems[4];
        result.m_backend.data._M_elems[5] = local_3a0.m_backend.data._M_elems[5];
        result.m_backend.data._M_elems._24_5_ = local_3a0.m_backend.data._M_elems._24_5_;
        result.m_backend.data._M_elems[7]._1_3_ = local_3a0.m_backend.data._M_elems[7]._1_3_;
        result.m_backend.data._M_elems._32_5_ = local_3a0.m_backend.data._M_elems._32_5_;
        result.m_backend.data._M_elems[9]._1_3_ = local_3a0.m_backend.data._M_elems[9]._1_3_;
        result.m_backend.exp = local_3a0.m_backend.exp;
        result.m_backend.neg = local_3a0.m_backend.neg;
        result.m_backend.fpclass = local_3a0.m_backend.fpclass;
        result.m_backend.prec_elem = local_3a0.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&result.m_backend,&vv);
        result_5.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
        result_5.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
        result_5.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
        result_5.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
        result_5.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
        result_5.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
        result_5.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
        result_5.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
        result_5.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
        result_5.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
        result_5.m_backend.exp = result.m_backend.exp;
        result_5.m_backend.neg = result.m_backend.neg;
        result_5.m_backend.fpclass = result.m_backend.fpclass;
        result_5.m_backend.prec_elem = result.m_backend.prec_elem;
        if (cVar2 == '\0') {
          local_2a8.m_backend.data._M_elems[9]._1_3_ = local_4d8.data._M_elems[9]._1_3_;
          local_2a8.m_backend.data._M_elems._32_5_ = local_4d8.data._M_elems._32_5_;
          local_2a8.m_backend.data._M_elems[7]._1_3_ = local_4d8.data._M_elems[7]._1_3_;
          local_2a8.m_backend.data._M_elems._24_5_ = local_4d8.data._M_elems._24_5_;
          local_2a8.m_backend.data._M_elems[4] = local_4d8.data._M_elems[4];
          local_2a8.m_backend.data._M_elems[5] = local_4d8.data._M_elems[5];
          local_2a8.m_backend.data._M_elems[0] = local_4d8.data._M_elems[0];
          local_2a8.m_backend.data._M_elems[1] = local_4d8.data._M_elems[1];
          local_2a8.m_backend.data._M_elems[2] = local_4d8.data._M_elems[2];
          local_2a8.m_backend.data._M_elems[3] = local_4d8.data._M_elems[3];
          local_2a8.m_backend.exp = local_4d8.exp;
          local_2a8.m_backend.neg = local_4d8.neg;
          local_2a8.m_backend.fpclass = local_4d8.fpclass;
          local_2a8.m_backend.prec_elem = local_4d8.prec_elem;
          pnVar10 = &result_5;
          pnVar11 = &local_2a8;
        }
        else {
          local_268.m_backend.data._M_elems[9]._1_3_ = local_4d8.data._M_elems[9]._1_3_;
          local_268.m_backend.data._M_elems._32_5_ = local_4d8.data._M_elems._32_5_;
          local_268.m_backend.data._M_elems[7]._1_3_ = local_4d8.data._M_elems[7]._1_3_;
          local_268.m_backend.data._M_elems._24_5_ = local_4d8.data._M_elems._24_5_;
          local_268.m_backend.data._M_elems[4] = local_4d8.data._M_elems[4];
          local_268.m_backend.data._M_elems[5] = local_4d8.data._M_elems[5];
          local_268.m_backend.data._M_elems[0] = local_4d8.data._M_elems[0];
          local_268.m_backend.data._M_elems[1] = local_4d8.data._M_elems[1];
          local_268.m_backend.data._M_elems[2] = local_4d8.data._M_elems[2];
          local_268.m_backend.data._M_elems[3] = local_4d8.data._M_elems[3];
          local_268.m_backend.exp = local_4d8.exp;
          local_268.m_backend.neg = local_4d8.neg;
          local_268.m_backend.fpclass = local_4d8.fpclass;
          local_268.m_backend.prec_elem = local_4d8.prec_elem;
          pnVar10 = &lowstab;
          pnVar11 = &local_268;
        }
        leave = minSelect(this,&sel,pnVar10,&bestDelta,pnVar11);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&vv,2,(type *)0x0);
        result.m_backend.data._M_elems._32_5_ = delta_shift.m_backend.data._M_elems._32_5_;
        result.m_backend.data._M_elems[9]._1_3_ = delta_shift.m_backend.data._M_elems[9]._1_3_;
        result.m_backend.data._M_elems[4] = delta_shift.m_backend.data._M_elems[4];
        result.m_backend.data._M_elems[5] = delta_shift.m_backend.data._M_elems[5];
        result.m_backend.data._M_elems._24_5_ = delta_shift.m_backend.data._M_elems._24_5_;
        result.m_backend.data._M_elems[7]._1_3_ = delta_shift.m_backend.data._M_elems[7]._1_3_;
        result.m_backend.data._M_elems[0] = delta_shift.m_backend.data._M_elems[0];
        result.m_backend.data._M_elems[1] = delta_shift.m_backend.data._M_elems[1];
        result.m_backend.data._M_elems[2] = delta_shift.m_backend.data._M_elems[2];
        result.m_backend.data._M_elems[3] = delta_shift.m_backend.data._M_elems[3];
        result.m_backend.exp = delta_shift.m_backend.exp;
        result.m_backend.neg = delta_shift.m_backend.neg;
        result.m_backend.fpclass = delta_shift.m_backend.fpclass;
        result.m_backend.prec_elem = delta_shift.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&result.m_backend,&vv);
        iVar9 = 2;
        if ((bestDelta.m_backend.fpclass != cpp_dec_float_NaN) &&
           (result.m_backend.fpclass != cpp_dec_float_NaN)) {
          iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&bestDelta.m_backend,&result.m_backend);
          iVar9 = (iVar9 >> 0x1f) + 2;
        }
        iVar8 = iVar8 + iVar9;
      }
      local_2e8.m_backend.data._M_elems[9]._1_3_ = maxabs.m_backend.data._M_elems[9]._1_3_;
      local_2e8.m_backend.data._M_elems._32_5_ = maxabs.m_backend.data._M_elems._32_5_;
      local_2e8.m_backend.data._M_elems[7]._1_3_ = maxabs.m_backend.data._M_elems[7]._1_3_;
      local_2e8.m_backend.data._M_elems._24_5_ = maxabs.m_backend.data._M_elems._24_5_;
      local_2e8.m_backend.data._M_elems[4] = maxabs.m_backend.data._M_elems[4];
      local_2e8.m_backend.data._M_elems[5] = maxabs.m_backend.data._M_elems[5];
      local_2e8.m_backend.data._M_elems[0] = maxabs.m_backend.data._M_elems[0];
      local_2e8.m_backend.data._M_elems[1] = maxabs.m_backend.data._M_elems[1];
      local_2e8.m_backend.data._M_elems[2] = maxabs.m_backend.data._M_elems[2];
      local_2e8.m_backend.data._M_elems[3] = maxabs.m_backend.data._M_elems[3];
      local_2e8.m_backend.exp = maxabs.m_backend.exp;
      local_2e8.m_backend.neg = maxabs.m_backend.neg;
      local_2e8.m_backend.fpclass = maxabs.m_backend.fpclass;
      local_2e8.m_backend.prec_elem = maxabs.m_backend.prec_elem;
      bVar12 = minReLeave(this,&sel,leave,&local_2e8,polish);
    } while ((bVar12) && (relax(this), iVar8 < 2));
  }
  else {
    iVar8 = 0;
    do {
      uVar5 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
      local_4d8.data._M_elems._32_5_ = SUB85(uVar5,0);
      local_4d8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_4d8.data._M_elems._0_8_ = *(undefined8 *)(val->m_backend).data._M_elems;
      local_4d8.data._M_elems._8_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 2);
      local_4d8.data._M_elems._16_8_ = *(undefined8 *)((val->m_backend).data._M_elems + 4);
      uVar5 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
      local_4d8.data._M_elems._24_5_ = SUB85(uVar5,0);
      local_4d8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar5 >> 0x28);
      local_4d8.exp = (val->m_backend).exp;
      local_4d8.neg = (val->m_backend).neg;
      local_4d8.fpclass = (val->m_backend).fpclass;
      local_4d8.prec_elem = (val->m_backend).prec_elem;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&maxabs,0.0);
      pSVar6 = (this->
               super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).thesolver;
      leave = maxDelta(this,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_4d8,&maxabs,pSVar6->theFvec,&pSVar6->theLBbound,
                       &pSVar6->theUBbound,0,1);
      bVar12 = false;
      if ((local_4d8.fpclass != cpp_dec_float_NaN) &&
         ((val->m_backend).fpclass != cpp_dec_float_NaN)) {
        iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_4d8,&val->m_backend);
        bVar12 = iVar9 == 0;
      }
      if (leave == 0xffffffff) {
        return -1;
      }
      if (bVar12) {
        return -1;
      }
      local_a8.m_backend.data._M_elems[9]._1_3_ = maxabs.m_backend.data._M_elems[9]._1_3_;
      local_a8.m_backend.data._M_elems._32_5_ = maxabs.m_backend.data._M_elems._32_5_;
      local_a8.m_backend.data._M_elems[7]._1_3_ = maxabs.m_backend.data._M_elems[7]._1_3_;
      local_a8.m_backend.data._M_elems._24_5_ = maxabs.m_backend.data._M_elems._24_5_;
      local_a8.m_backend.data._M_elems[4] = maxabs.m_backend.data._M_elems[4];
      local_a8.m_backend.data._M_elems[5] = maxabs.m_backend.data._M_elems[5];
      local_a8.m_backend.data._M_elems[0] = maxabs.m_backend.data._M_elems[0];
      local_a8.m_backend.data._M_elems[1] = maxabs.m_backend.data._M_elems[1];
      local_a8.m_backend.data._M_elems[2] = maxabs.m_backend.data._M_elems[2];
      local_a8.m_backend.data._M_elems[3] = maxabs.m_backend.data._M_elems[3];
      local_a8.m_backend.exp = maxabs.m_backend.exp;
      local_a8.m_backend.neg = maxabs.m_backend.neg;
      local_a8.m_backend.fpclass = maxabs.m_backend.fpclass;
      local_a8.m_backend.prec_elem = maxabs.m_backend.prec_elem;
      bVar12 = maxShortLeave(this,&sel,leave,&local_a8);
      if (!bVar12) {
        result_5.m_backend.fpclass = cpp_dec_float_finite;
        result_5.m_backend.prec_elem = 10;
        result_5.m_backend.data._M_elems._0_16_ = ZEXT816(0);
        result_5.m_backend.data._M_elems[4] = 0;
        result_5.m_backend.data._M_elems[5] = 0;
        result_5.m_backend.data._M_elems._24_5_ = 0;
        result_5.m_backend.data._M_elems[7]._1_3_ = 0;
        result_5.m_backend.data._M_elems._32_5_ = 0;
        result_5.m_backend.data._M_elems[9]._1_3_ = 0;
        result_5.m_backend.exp = 0;
        result_5.m_backend.neg = false;
        bestDelta.m_backend.fpclass = cpp_dec_float_finite;
        bestDelta.m_backend.prec_elem = 10;
        bestDelta.m_backend.data._M_elems[0] = 0;
        bestDelta.m_backend.data._M_elems[1] = 0;
        bestDelta.m_backend.data._M_elems[2] = 0;
        bestDelta.m_backend.data._M_elems[3] = 0;
        bestDelta.m_backend.data._M_elems[4] = 0;
        bestDelta.m_backend.data._M_elems[5] = 0;
        bestDelta.m_backend.data._M_elems._24_5_ = 0;
        bestDelta.m_backend.data._M_elems[7]._1_3_ = 0;
        bestDelta.m_backend.data._M_elems._32_5_ = 0;
        bestDelta.m_backend.data._M_elems[9]._1_3_ = 0;
        bestDelta.m_backend.exp = 0;
        bestDelta.m_backend.neg = false;
        local_e8.m_backend.data._M_elems[7]._1_3_ = maxabs.m_backend.data._M_elems[7]._1_3_;
        local_e8.m_backend.data._M_elems._24_5_ = maxabs.m_backend.data._M_elems._24_5_;
        local_e8.m_backend.data._M_elems[0] = maxabs.m_backend.data._M_elems[0];
        local_e8.m_backend.data._M_elems[1] = maxabs.m_backend.data._M_elems[1];
        local_e8.m_backend.data._M_elems[2] = maxabs.m_backend.data._M_elems[2];
        local_e8.m_backend.data._M_elems[3] = maxabs.m_backend.data._M_elems[3];
        local_e8.m_backend.data._M_elems[4] = maxabs.m_backend.data._M_elems[4];
        local_e8.m_backend.data._M_elems[5] = maxabs.m_backend.data._M_elems[5];
        local_e8.m_backend.data._M_elems[9]._1_3_ = maxabs.m_backend.data._M_elems[9]._1_3_;
        local_e8.m_backend.data._M_elems._32_5_ = maxabs.m_backend.data._M_elems._32_5_;
        local_e8.m_backend.exp = maxabs.m_backend.exp;
        local_e8.m_backend.neg = maxabs.m_backend.neg;
        local_e8.m_backend.fpclass = maxabs.m_backend.fpclass;
        local_e8.m_backend.prec_elem = maxabs.m_backend.prec_elem;
        minStability(&local_3a0,this,&local_e8);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        vv.fpclass = cpp_dec_float_finite;
        vv.prec_elem = 10;
        vv.data._M_elems[0] = 0;
        vv.data._M_elems[1] = 0;
        vv.data._M_elems[2] = 0;
        vv.data._M_elems[3] = 0;
        vv.data._M_elems[4] = 0;
        vv.data._M_elems[5] = 0;
        vv.data._M_elems._24_5_ = 0;
        vv.data._M_elems[7]._1_3_ = 0;
        vv.data._M_elems._32_5_ = 0;
        vv.data._M_elems[9]._1_3_ = 0;
        vv.exp = 0;
        vv.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&vv,100.0);
        result.m_backend.data._M_elems[0] = local_3a0.m_backend.data._M_elems[0];
        result.m_backend.data._M_elems[1] = local_3a0.m_backend.data._M_elems[1];
        result.m_backend.data._M_elems[2] = local_3a0.m_backend.data._M_elems[2];
        result.m_backend.data._M_elems[3] = local_3a0.m_backend.data._M_elems[3];
        result.m_backend.data._M_elems[4] = local_3a0.m_backend.data._M_elems[4];
        result.m_backend.data._M_elems[5] = local_3a0.m_backend.data._M_elems[5];
        result.m_backend.data._M_elems._24_5_ = local_3a0.m_backend.data._M_elems._24_5_;
        result.m_backend.data._M_elems[7]._1_3_ = local_3a0.m_backend.data._M_elems[7]._1_3_;
        result.m_backend.data._M_elems._32_5_ = local_3a0.m_backend.data._M_elems._32_5_;
        result.m_backend.data._M_elems[9]._1_3_ = local_3a0.m_backend.data._M_elems[9]._1_3_;
        result.m_backend.exp = local_3a0.m_backend.exp;
        result.m_backend.neg = local_3a0.m_backend.neg;
        result.m_backend.fpclass = local_3a0.m_backend.fpclass;
        result.m_backend.prec_elem = local_3a0.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&result.m_backend,&vv);
        result_5.m_backend.data._M_elems[2] = result.m_backend.data._M_elems[2];
        result_5.m_backend.data._M_elems[3] = result.m_backend.data._M_elems[3];
        result_5.m_backend.data._M_elems[0] = result.m_backend.data._M_elems[0];
        result_5.m_backend.data._M_elems[1] = result.m_backend.data._M_elems[1];
        result_5.m_backend.data._M_elems[4] = result.m_backend.data._M_elems[4];
        result_5.m_backend.data._M_elems[5] = result.m_backend.data._M_elems[5];
        result_5.m_backend.data._M_elems._24_5_ = result.m_backend.data._M_elems._24_5_;
        result_5.m_backend.data._M_elems[7]._1_3_ = result.m_backend.data._M_elems[7]._1_3_;
        result_5.m_backend.data._M_elems._32_5_ = result.m_backend.data._M_elems._32_5_;
        result_5.m_backend.data._M_elems[9]._1_3_ = result.m_backend.data._M_elems[9]._1_3_;
        result_5.m_backend.exp = result.m_backend.exp;
        result_5.m_backend.neg = result.m_backend.neg;
        result_5.m_backend.fpclass = result.m_backend.fpclass;
        result_5.m_backend.prec_elem = result.m_backend.prec_elem;
        if (cVar2 == '\0') {
          local_168.m_backend.data._M_elems[9]._1_3_ = local_4d8.data._M_elems[9]._1_3_;
          local_168.m_backend.data._M_elems._32_5_ = local_4d8.data._M_elems._32_5_;
          local_168.m_backend.data._M_elems[7]._1_3_ = local_4d8.data._M_elems[7]._1_3_;
          local_168.m_backend.data._M_elems._24_5_ = local_4d8.data._M_elems._24_5_;
          local_168.m_backend.data._M_elems[4] = local_4d8.data._M_elems[4];
          local_168.m_backend.data._M_elems[5] = local_4d8.data._M_elems[5];
          local_168.m_backend.data._M_elems[0] = local_4d8.data._M_elems[0];
          local_168.m_backend.data._M_elems[1] = local_4d8.data._M_elems[1];
          local_168.m_backend.data._M_elems[2] = local_4d8.data._M_elems[2];
          local_168.m_backend.data._M_elems[3] = local_4d8.data._M_elems[3];
          local_168.m_backend.exp = local_4d8.exp;
          local_168.m_backend.neg = local_4d8.neg;
          local_168.m_backend.fpclass = local_4d8.fpclass;
          local_168.m_backend.prec_elem = local_4d8.prec_elem;
          pnVar10 = &result_5;
          pnVar11 = &local_168;
        }
        else {
          local_128.m_backend.data._M_elems[9]._1_3_ = local_4d8.data._M_elems[9]._1_3_;
          local_128.m_backend.data._M_elems._32_5_ = local_4d8.data._M_elems._32_5_;
          local_128.m_backend.data._M_elems[7]._1_3_ = local_4d8.data._M_elems[7]._1_3_;
          local_128.m_backend.data._M_elems._24_5_ = local_4d8.data._M_elems._24_5_;
          local_128.m_backend.data._M_elems[4] = local_4d8.data._M_elems[4];
          local_128.m_backend.data._M_elems[5] = local_4d8.data._M_elems[5];
          local_128.m_backend.data._M_elems[0] = local_4d8.data._M_elems[0];
          local_128.m_backend.data._M_elems[1] = local_4d8.data._M_elems[1];
          local_128.m_backend.data._M_elems[2] = local_4d8.data._M_elems[2];
          local_128.m_backend.data._M_elems[3] = local_4d8.data._M_elems[3];
          local_128.m_backend.exp = local_4d8.exp;
          local_128.m_backend.neg = local_4d8.neg;
          local_128.m_backend.fpclass = local_4d8.fpclass;
          local_128.m_backend.prec_elem = local_4d8.prec_elem;
          pnVar10 = &lowstab;
          pnVar11 = &local_128;
        }
        leave = maxSelect(this,&sel,pnVar10,&bestDelta,pnVar11);
        result.m_backend.fpclass = cpp_dec_float_finite;
        result.m_backend.prec_elem = 10;
        result.m_backend.data._M_elems[0] = 0;
        result.m_backend.data._M_elems[1] = 0;
        result.m_backend.data._M_elems[2] = 0;
        result.m_backend.data._M_elems[3] = 0;
        result.m_backend.data._M_elems[4] = 0;
        result.m_backend.data._M_elems[5] = 0;
        result.m_backend.data._M_elems._24_5_ = 0;
        result.m_backend.data._M_elems[7]._1_3_ = 0;
        result.m_backend.data._M_elems._32_5_ = 0;
        result.m_backend.data._M_elems[9]._1_3_ = 0;
        result.m_backend.exp = 0;
        result.m_backend.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                  (&vv,2,(type *)0x0);
        result.m_backend.data._M_elems._32_5_ = delta_shift.m_backend.data._M_elems._32_5_;
        result.m_backend.data._M_elems[9]._1_3_ = delta_shift.m_backend.data._M_elems[9]._1_3_;
        result.m_backend.data._M_elems[4] = delta_shift.m_backend.data._M_elems[4];
        result.m_backend.data._M_elems[5] = delta_shift.m_backend.data._M_elems[5];
        result.m_backend.data._M_elems._24_5_ = delta_shift.m_backend.data._M_elems._24_5_;
        result.m_backend.data._M_elems[7]._1_3_ = delta_shift.m_backend.data._M_elems[7]._1_3_;
        result.m_backend.data._M_elems[0] = delta_shift.m_backend.data._M_elems[0];
        result.m_backend.data._M_elems[1] = delta_shift.m_backend.data._M_elems[1];
        result.m_backend.data._M_elems[2] = delta_shift.m_backend.data._M_elems[2];
        result.m_backend.data._M_elems[3] = delta_shift.m_backend.data._M_elems[3];
        result.m_backend.exp = delta_shift.m_backend.exp;
        result.m_backend.neg = delta_shift.m_backend.neg;
        result.m_backend.fpclass = delta_shift.m_backend.fpclass;
        result.m_backend.prec_elem = delta_shift.m_backend.prec_elem;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                  (&result.m_backend,&vv);
        iVar9 = 2;
        if ((bestDelta.m_backend.fpclass != cpp_dec_float_NaN) &&
           (result.m_backend.fpclass != cpp_dec_float_NaN)) {
          iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                            (&bestDelta.m_backend,&result.m_backend);
          iVar9 = (iVar9 >> 0x1f) + 2;
        }
        iVar8 = iVar8 + iVar9;
      }
      local_1a8.m_backend.data._M_elems[9]._1_3_ = maxabs.m_backend.data._M_elems[9]._1_3_;
      local_1a8.m_backend.data._M_elems._32_5_ = maxabs.m_backend.data._M_elems._32_5_;
      local_1a8.m_backend.data._M_elems[7]._1_3_ = maxabs.m_backend.data._M_elems[7]._1_3_;
      local_1a8.m_backend.data._M_elems._24_5_ = maxabs.m_backend.data._M_elems._24_5_;
      local_1a8.m_backend.data._M_elems[4] = maxabs.m_backend.data._M_elems[4];
      local_1a8.m_backend.data._M_elems[5] = maxabs.m_backend.data._M_elems[5];
      local_1a8.m_backend.data._M_elems[0] = maxabs.m_backend.data._M_elems[0];
      local_1a8.m_backend.data._M_elems[1] = maxabs.m_backend.data._M_elems[1];
      local_1a8.m_backend.data._M_elems[2] = maxabs.m_backend.data._M_elems[2];
      local_1a8.m_backend.data._M_elems[3] = maxabs.m_backend.data._M_elems[3];
      local_1a8.m_backend.exp = maxabs.m_backend.exp;
      local_1a8.m_backend.neg = maxabs.m_backend.neg;
      local_1a8.m_backend.fpclass = maxabs.m_backend.fpclass;
      local_1a8.m_backend.prec_elem = maxabs.m_backend.prec_elem;
      bVar12 = maxReLeave(this,&sel,leave,&local_1a8,polish);
    } while ((bVar12) && (relax(this), iVar8 < 2));
  }
  if (polish && -1 < (int)leave) {
    pSVar6 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).thesolver;
    pSVar7 = (pSVar6->
             super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).theBaseId.data;
    vv.data._M_elems._0_8_ = pSVar7[leave].super_DataKey;
    if (pSVar6->polishObj == POLISH_FRACTIONALITY) {
      iVar8 = pSVar7[leave].super_DataKey.info;
      if ((pSVar6->integerVariables).thesize ==
          (pSVar6->
          super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum) {
        if ((0 < iVar8) &&
           (iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::number(&pSVar6->
                              super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             ,(SPxId *)&vv), (pSVar6->integerVariables).data[iVar8] == 1)) {
          return -1;
        }
      }
      else if (0 < iVar8) {
        return -1;
      }
    }
    else if (pSVar6->polishObj == POLISH_INTEGRALITY) {
      if ((int)vv.data._M_elems[0] < 0) {
        return -1;
      }
      if (((vv.data._M_elems[0] != 0) &&
          ((pSVar6->integerVariables).thesize ==
           (pSVar6->
           super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).
           super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .
           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .set.thenum)) &&
         (iVar8 = SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::number(&pSVar6->
                            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ,(SPxId *)&vv), (pSVar6->integerVariables).data[iVar8] == 0)) {
        return -1;
      }
    }
  }
  if ((int)leave < 0) {
    iVar8 = (*(this->
              super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._vptr_SPxRatioTester[3])(this);
    a = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var_00,iVar8) + 0x1e0));
    bestDelta.m_backend.fpclass = cpp_dec_float_finite;
    bestDelta.m_backend.prec_elem = 10;
    bestDelta.m_backend.data._M_elems[0] = 0;
    bestDelta.m_backend.data._M_elems[1] = 0;
    bestDelta.m_backend.data._M_elems[2] = 0;
    bestDelta.m_backend.data._M_elems[3] = 0;
    bestDelta.m_backend.data._M_elems[4] = 0;
    bestDelta.m_backend.data._M_elems[5] = 0;
    bestDelta.m_backend.data._M_elems._24_5_ = 0;
    bestDelta.m_backend.data._M_elems[7]._1_3_ = 0;
    bestDelta.m_backend.data._M_elems._32_5_ = 0;
    bestDelta.m_backend.data._M_elems[9]._1_3_ = 0;
    bestDelta.m_backend.exp = 0;
    bestDelta.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&bestDelta,a);
    result_5.m_backend.fpclass = cpp_dec_float_finite;
    result_5.m_backend.prec_elem = 10;
    result_5.m_backend.data._M_elems[0] = 0;
    result_5.m_backend.data._M_elems[1] = 0;
    result_5.m_backend.data._M_elems[2] = 0;
    result_5.m_backend.data._M_elems[3] = 0;
    result_5.m_backend.data._M_elems[4] = 0;
    result_5.m_backend.data._M_elems[5] = 0;
    result_5.m_backend.data._M_elems._24_5_ = 0;
    result_5.m_backend.data._M_elems[7]._1_3_ = 0;
    result_5.m_backend.data._M_elems._32_5_ = 0;
    result_5.m_backend.data._M_elems[9]._1_3_ = 0;
    result_5.m_backend.exp = 0;
    result_5.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
              (&vv,2,(type *)0x0);
    result_5.m_backend.data._M_elems._32_5_ = bestDelta.m_backend.data._M_elems._32_5_;
    result_5.m_backend.data._M_elems[9]._1_3_ = bestDelta.m_backend.data._M_elems[9]._1_3_;
    result_5.m_backend.data._M_elems[4] = bestDelta.m_backend.data._M_elems[4];
    result_5.m_backend.data._M_elems[5] = bestDelta.m_backend.data._M_elems[5];
    result_5.m_backend.data._M_elems._24_5_ = bestDelta.m_backend.data._M_elems._24_5_;
    result_5.m_backend.data._M_elems[7]._1_3_ = bestDelta.m_backend.data._M_elems[7]._1_3_;
    result_5.m_backend.data._M_elems[2] = bestDelta.m_backend.data._M_elems[2];
    result_5.m_backend.data._M_elems[3] = bestDelta.m_backend.data._M_elems[3];
    result_5.m_backend.data._M_elems[0] = bestDelta.m_backend.data._M_elems[0];
    result_5.m_backend.data._M_elems[1] = bestDelta.m_backend.data._M_elems[1];
    result_5.m_backend.exp = bestDelta.m_backend.exp;
    result_5.m_backend.neg = bestDelta.m_backend.neg;
    result_5.m_backend.fpclass = bestDelta.m_backend.fpclass;
    result_5.m_backend.prec_elem = bestDelta.m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
              (&result_5.m_backend,&vv);
    if ((this->minStab).m_backend.fpclass == cpp_dec_float_NaN) {
      return leave;
    }
    if (result_5.m_backend.fpclass == cpp_dec_float_NaN) {
      return leave;
    }
    iVar8 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&(this->minStab).m_backend,&result_5.m_backend);
    if (iVar8 < 1) {
      return leave;
    }
  }
  *(ulong *)((val->m_backend).data._M_elems + 8) =
       CONCAT35(sel.m_backend.data._M_elems[9]._1_3_,sel.m_backend.data._M_elems._32_5_);
  *(undefined8 *)((val->m_backend).data._M_elems + 4) = sel.m_backend.data._M_elems._16_8_;
  *(ulong *)((val->m_backend).data._M_elems + 6) =
       CONCAT35(sel.m_backend.data._M_elems[7]._1_3_,sel.m_backend.data._M_elems._24_5_);
  *(undefined8 *)(val->m_backend).data._M_elems = sel.m_backend.data._M_elems._0_8_;
  *(undefined8 *)((val->m_backend).data._M_elems + 2) = sel.m_backend.data._M_elems._8_8_;
  (val->m_backend).exp = sel.m_backend.exp;
  (val->m_backend).neg = sel.m_backend.neg;
  (val->m_backend).fpclass = sel.m_backend.fpclass;
  (val->m_backend).prec_elem = sel.m_backend.prec_elem;
  if (-1 < (int)leave) {
    tighten(this);
  }
  return leave;
}

Assistant:

int SPxFastRT<R>::selectLeave(R& val, R, bool polish)
{
   R maxabs, max, sel;
   R delta_shift = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_DELTA_SHIFT);
   int leave = -1;
   int cnt = 0;

   assert(this->m_type == SPxSolverBase<R>::ENTER);

   // force instable pivot iff true (see explanation in enter.cpp and spxsolve.hpp)
   bool instable = this->solver()->instableEnter;
   R lowstab = this->tolerances()->scaleAccordingToEpsilon(SOPLEX_LOWSTAB);
   assert(!instable || this->solver()->instableEnterId.isValid());

   resetTols();

   if(val > epsilonZero())
   {
      do
      {
         // phase 1:
         max = val;
         maxabs = 0.0;
         leave = maxDelta(max, maxabs);

         assert(leave < 0 || !(this->thesolver->baseId(leave).isSPxColId()) ||
                this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(
                         leave)))) != SPxBasisBase<R>::Desc::P_FIXED);

         if(max == val || leave == -1)
         {
            assert(max == val && leave == -1);
            return -1;
         }

         if(!maxShortLeave(sel, leave, maxabs))
         {
            // phase 2:
            R stab, bestDelta;

            stab = 100.0 * minStability(maxabs);

            // force instable pivot iff instable is true (see explanation in enter.hpp and spxsolve.hpp)
            if(instable)
               leave = maxSelect(sel, lowstab, bestDelta, max);
            else
               leave = maxSelect(sel, stab, bestDelta, max);

            if(bestDelta < delta_shift * SOPLEX_TRIES)
               cnt++;
            else
               cnt += SOPLEX_TRIES;
         }

         if(!maxReLeave(sel, leave, maxabs, polish))
            break;

         relax();
      }
      while(cnt < SOPLEX_TRIES);
   }
   else if(val < -epsilonZero())
   {
      do
      {
         max = val;
         maxabs = 0;
         leave = minDelta(max, maxabs);

         assert(leave < 0 || !(this->thesolver->baseId(leave).isSPxColId()) ||
                this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(
                         leave)))) != SPxBasisBase<R>::Desc::P_FIXED);

         if(max == val || leave == -1)
         {
            assert(max == val && leave == -1);
            return -1;
         }

         if(!minShortLeave(sel, leave, maxabs))
         {
            // phase 2:
            R stab, bestDelta;

            stab = 100.0 * minStability(maxabs);

            // force instable pivot iff instable is true (see explanation in enter.hpp and spxsolve.hpp)
            if(instable)
               leave = minSelect(sel, lowstab, bestDelta, max);
            else
               leave = minSelect(sel, stab, bestDelta, max);

            assert(leave < 0 || !(this->thesolver->baseId(leave).isSPxColId())
                   || this->thesolver->desc().colStatus(this->thesolver->number(SPxColId(this->thesolver->baseId(
                            leave)))) != SPxBasisBase<R>::Desc::P_FIXED);

            if(bestDelta < delta_shift * SOPLEX_TRIES)
               cnt++;
            else
               cnt += SOPLEX_TRIES;
         }

         if(!minReLeave(sel, leave, maxabs, polish))
            break;

         relax();
      }
      while(cnt < SOPLEX_TRIES);
   }
   else
      return -1;

   SPX_DEBUG(

      if(leave >= 0)
      std::cout
      << "DFSTRT01 "
      << this->thesolver->basis().iteration() << "("
      << std::setprecision(6) << this->thesolver->value() << ","
      << std::setprecision(2) << this->thesolver->basis().stability() << "):"
      << leave << "\t"
      << std::setprecision(4) << sel << " "
      << std::setprecision(4) << this->thesolver->fVec().delta()[leave] << " "
      << std::setprecision(6) << maxabs
      << std::endl;
      else
         std::cout << "DFSTRT02 " << this->thesolver->basis().iteration()
         << ": skipping instable pivot" << std::endl;
      )

         if(polish && leave >= 0)
         {
            assert(this->thesolver->rep() == SPxSolverBase<R>::COLUMN);
            SPxId leaveId = this->thesolver->baseId(leave);

            // decide whether the chosen leave index contributes to the polishing objective
            if(this->thesolver->polishObj == SPxSolverBase<R>::POLISH_INTEGRALITY)
            {
               // only allow (integer) variables to leave the basis
               if(leaveId.isSPxRowId())
                  return -1;
               else if(this->thesolver->integerVariables.size() == this->thesolver->nCols())
               {
                  if(leaveId.isSPxColId() && this->thesolver->integerVariables[this->thesolver->number(leaveId)] == 0)
                     return -1;
               }
            }
            else if(this->thesolver->polishObj == SPxSolverBase<R>::POLISH_FRACTIONALITY)
            {
               // only allow slacks and continuous variables to leave the basis
               if(this->thesolver->integerVariables.size() == this->thesolver->nCols())
               {
                  if(this->thesolver->baseId(leave).isSPxColId()
                        && this->thesolver->integerVariables[this->thesolver->number(leaveId)] == 1)
                     return -1;
               }
               else if(this->thesolver->baseId(leave).isSPxColId())
                  return -1;
            }
         }